

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

RegSlot __thiscall Js::FunctionBody::GetFirstTmpReg(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  
  RVar3 = GetFirstTmpRegister(this);
  if (RVar3 == 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x4ab,"(GetFirstTmpRegister() != Constants::NoRegister)",
                                "First temp hasn\'t been set yet");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  RVar3 = GetFirstTmpRegister(this);
  return RVar3;
}

Assistant:

RegSlot
    FunctionBody::GetFirstTmpReg()
    {
        AssertMsg(GetFirstTmpRegister() != Constants::NoRegister, "First temp hasn't been set yet");
        return GetFirstTmpRegister();
    }